

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.hpp
# Opt level: O2

void __thiscall
duckdb::BaseAppender::AppendRowRecursive<duckdb::Value,duckdb::Value,duckdb::Value>
          (BaseAppender *this,Value *value,Value *args,Value *args_1)

{
  Value local_e0 [64];
  Value local_a0 [64];
  Value local_60 [64];
  
  duckdb::Value::Value(local_60,value);
  duckdb::BaseAppender::Append<duckdb::Value>(this,local_60);
  duckdb::Value::~Value(local_60);
  duckdb::Value::Value(local_a0,args);
  duckdb::Value::Value(local_e0,args_1);
  AppendRowRecursive<duckdb::Value,duckdb::Value>(this,local_a0,local_e0);
  duckdb::Value::~Value(local_e0);
  duckdb::Value::~Value(local_a0);
  return;
}

Assistant:

void AppendRowRecursive(T value, ARGS... args) {
		Append<T>(value);
		AppendRowRecursive(args...);
	}